

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Vertex2DTextureCase::iterate(Vertex2DTextureCase *this)

{
  TextureFormat *pTVar1;
  int iVar2;
  WrapMode WVar3;
  WrapMode WVar4;
  uint height;
  uint uVar5;
  GLuint program;
  Texture2D *pTVar6;
  RenderContext *context;
  undefined8 uVar7;
  undefined8 uVar8;
  Vertex2DTextureCase *pVVar9;
  undefined4 uVar10;
  uint *puVar11;
  bool bVar12;
  int i;
  deUint32 dVar13;
  deUint32 dVar14;
  int iVar15;
  GLuint GVar16;
  GLint GVar17;
  RenderTarget *pRVar18;
  long lVar19;
  char *description;
  undefined2 uVar20;
  int iVar21;
  undefined1 *puVar22;
  undefined2 uVar23;
  int i_1;
  int iVar24;
  long lVar25;
  ulong uVar26;
  pointer data;
  int iVar27;
  undefined2 uVar28;
  int iVar29;
  uint uVar30;
  int i_2;
  ulong uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float __x;
  Vector<float,_2> res_2;
  Vector<float,_2> res_1;
  Surface resImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> quadColors;
  Vector<float,_2> result;
  Vec2 quadVertices [4];
  Surface refImage;
  Random rnd;
  undefined1 local_258 [16];
  float local_248;
  float local_244;
  Vertex2DTextureCase *local_240;
  TextureFormat local_238;
  undefined8 uStack_230;
  ulong local_220;
  ulong local_218;
  undefined1 local_210 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_208;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vStack_1f0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_1d8;
  uint *local_1c0;
  RGBA local_1b4;
  WrapMode local_1b0;
  int local_1ac;
  int local_1a8;
  float local_1a4;
  undefined1 local_1a0 [8];
  pointer local_198;
  pointer local_190;
  float local_188 [4];
  ulong local_178;
  ulong local_170;
  undefined1 local_168 [28];
  float local_14c;
  undefined8 local_120;
  undefined8 local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  Surface local_f8;
  undefined8 local_e0;
  undefined1 local_d8 [28];
  undefined8 uStack_bc;
  int local_b4;
  undefined4 local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  deRandom local_40;
  
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar15 = pRVar18->m_width;
  if (0xff < pRVar18->m_width) {
    iVar15 = 0x100;
  }
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1ac = 0x100;
  if (pRVar18->m_height < 0x100) {
    local_1ac = pRVar18->m_height;
  }
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar18->m_width;
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar24 = pRVar18->m_height;
  dVar13 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deRandom_init(&local_40,dVar13);
  dVar13 = deRandom_getUint32(&local_40);
  dVar14 = deRandom_getUint32(&local_40);
  local_240 = this;
  glwUseProgram((this->m_program->m_program).m_program);
  iVar27 = iVar15 / 2;
  iVar29 = local_1ac / 2;
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  tcu::Surface::Surface(&local_f8,iVar15,local_1ac);
  local_d8._0_4_ = R;
  local_d8._4_4_ = SNORM_INT8;
  local_d8._8_4_ = iVar27;
  local_d8._12_4_ = iVar29;
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0x3fe66666;
  local_d8._24_4_ = 0x3fe66666;
  uStack_bc = 0xbe4ccccdbe99999a;
  local_170 = (ulong)dVar13 % (ulong)((iVar2 - iVar15) + 1);
  local_178 = (ulong)dVar14 % (ulong)((iVar24 - local_1ac) + 1);
  local_b4 = iVar27;
  local_b0 = 0;
  local_ac = iVar15 - iVar27;
  local_a8 = iVar29;
  local_a4 = 0;
  local_a0 = 0x3e99999a3e99999a;
  uStack_98 = 0x3f4ccccd3f666666;
  local_90 = 0;
  local_8c = iVar29;
  local_88 = iVar27;
  local_84 = local_1ac - iVar29;
  local_80 = 1;
  local_7c = 0x3fe666663fe66666;
  uStack_74 = 0xbe4ccccdbe99999a;
  local_6c = iVar27;
  local_68 = iVar29;
  local_64 = iVar15 - iVar27;
  local_60 = local_1ac - iVar29;
  local_5c = 1;
  local_58 = 0x3e99999a3e99999a;
  uStack_50 = 0x3f4ccccd3f666666;
  lVar25 = 0;
  local_1a8 = iVar15;
  do {
    pVVar9 = local_240;
    local_110 = lVar25;
    lVar25 = lVar25 * 0x24;
    local_1c0 = (uint *)(local_d8 + lVar25);
    WVar3 = *(WrapMode *)(local_d8 + lVar25 + 8);
    WVar4 = *(WrapMode *)(local_d8 + lVar25 + 0xc);
    local_168._4_4_ = WVar4;
    local_168._0_4_ = WVar3;
    local_210._0_4_ = 0.0;
    local_210._4_4_ = 0.0;
    lVar19 = 0;
    do {
      *(float *)(local_210 + lVar19 * 4) = (float)*(int *)(local_168 + lVar19 * 4);
      lVar19 = lVar19 + 1;
    } while (lVar19 == 1);
    iVar15 = *(int *)(local_d8 + lVar25 + 0x10);
    local_244 = calculateLod(local_240,(Vec2 *)(local_d8 + lVar25 + 0x14),(Vec2 *)local_210,iVar15);
    iVar2 = *(int *)((long)pVVar9->m_textures + (ulong)(local_244 <= 0.0) * 4 + -0x18);
    local_1b4.m_value = WVar3;
    local_1b0 = WVar4;
    pTVar6 = pVVar9->m_textures[iVar15];
    local_e0._0_4_ = (pTVar6->m_refTexture).m_width;
    local_e0._4_4_ = (pTVar6->m_refTexture).m_height;
    local_1a0 = (undefined1  [8])*(pointer *)(local_d8 + lVar25 + 0x14);
    local_198 = *(pointer *)((long)&uStack_bc + lVar25);
    local_210._0_4_ = 1.77965e-43;
    local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
    vStack_1f0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1f0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_1f0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              (&local_208,0xfc04);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (&local_1d8,(long)(local_210._0_4_ * local_210._0_4_ * 6));
    if (0 < (int)local_210._0_4_) {
      local_220 = 0;
      do {
        if (0 < (int)local_210._0_4_) {
          local_248 = (float)(int)local_220 / 127.0;
          local_218 = CONCAT44(local_218._4_4_,(float)((int)local_220 + 1) / 127.0);
          iVar15 = 0;
          do {
            fVar32 = (float)iVar15;
            iVar15 = iVar15 + 1;
            local_168._4_4_ = local_248;
            local_168._0_4_ = fVar32 / 127.0;
            local_168._8_4_ = (float)iVar15 / 127.0;
            local_168._12_4_ = local_248;
            local_168._16_4_ = fVar32 / 127.0;
            local_168._20_4_ = (float)local_218;
            local_168._24_4_ = (float)iVar15 / 127.0;
            uVar30 = (int)local_208.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_208.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_14c = (float)local_218;
            puVar22 = local_168;
            lVar25 = 0;
            do {
              local_120 = 0;
              local_188[0] = 0.0;
              local_188[1] = 0.0;
              lVar19 = 0;
              do {
                fVar32 = *(float *)((long)&local_120 + lVar19 * 4);
                dVar13 = (&local_1b4)[lVar19].m_value;
                fVar35 = (*(float *)(puVar22 + lVar19 * 4) * (float)(int)dVar13 + 0.5) - fVar32;
                fVar33 = floorf(fVar35);
                local_188[lVar19] =
                     ((fVar35 - fVar33) * 0.5 + fVar33 + 0.25 + -0.5 + fVar32) / (float)(int)dVar13;
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              local_238.order = R;
              local_238.type = SNORM_INT8;
              lVar19 = 0;
              do {
                (&local_238.order)[lVar19] = (ChannelOrder)(local_188[lVar19] + local_188[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              local_258._0_4_ = R;
              local_258._4_4_ = SNORM_INT8;
              lVar19 = 0;
              do {
                *(float *)(local_258 + lVar19 * 4) = (float)(&local_238.order)[lVar19] + -1.0;
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         &local_208,(Vector<float,_2> *)local_258);
              lVar25 = lVar25 + 1;
              puVar22 = puVar22 + 8;
            } while (lVar25 != 4);
            uVar28 = (undefined2)(uVar30 >> 3);
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_258._0_2_ = uVar28;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar28;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar23 = uVar28 + A;
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_258._0_2_ = uVar23;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar23;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar20 = uVar28 + I;
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_258._0_2_ = uVar20;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar20;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_258._0_2_ = uVar23;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar23;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_258._0_2_ = uVar28 + L;
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = local_258._0_2_;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_258._0_2_ = uVar20;
            if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        (&local_1d8,
                         (iterator)
                         local_1d8.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish,(unsigned_short *)local_258);
            }
            else {
              *local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_finish = uVar20;
              local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          } while (iVar15 < (int)local_210._0_4_);
        }
        uVar30 = (int)local_220 + 1;
        local_220 = (ulong)uVar30;
      } while ((int)uVar30 < (int)local_210._0_4_);
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              (&vStack_1f0,(long)(local_210._0_4_ * local_210._0_4_ * 4));
    if (0 < (int)local_210._0_4_) {
      fVar32 = (float)(int)local_210._0_4_;
      local_218 = local_218 & 0xffffffff00000000;
      do {
        if (0 < (int)local_210._0_4_) {
          local_248 = (float)(int)(float)local_218 / fVar32;
          iVar15 = 0;
          do {
            local_238.type = (ChannelType)local_248;
            local_238.order = (ChannelOrder)((float)iVar15 / fVar32);
            local_168._0_4_ = R;
            local_168._4_4_ = SNORM_INT8;
            lVar25 = 0;
            do {
              *(float *)(local_168 + lVar25 * 4) =
                   (float)(&local_238.order)[lVar25] * *(float *)(local_1a0 + lVar25 * 4);
              lVar25 = lVar25 + 1;
            } while (lVar25 == 1);
            local_258._0_4_ = R;
            local_258._4_4_ = SNORM_INT8;
            lVar25 = 0;
            do {
              *(float *)(local_258 + lVar25 * 4) =
                   *(float *)(local_168 + lVar25 * 4) + *(float *)((long)&local_198 + lVar25 * 4);
              uVar7 = local_258._0_8_;
              lVar25 = lVar25 + 1;
            } while (lVar25 == 1);
            iVar24 = 0;
            do {
              uVar8 = local_258._0_8_;
              if (((iVar2 == 0x2600) || (iVar2 == 0x2700)) || (iVar2 == 0x2702)) {
                lVar25 = 0;
                do {
                  *(undefined4 *)(local_168 + lVar25 * 4) = 0x3f000000;
                  lVar25 = lVar25 + 1;
                } while (lVar25 == 1);
                local_238.order = R;
                local_238.type = SNORM_INT8;
                lVar25 = 0;
                do {
                  fVar33 = *(float *)(local_168 + lVar25 * 4);
                  fVar35 = (float)*(int *)((long)&local_e0 + lVar25 * 4);
                  __x = (*(float *)(local_258 + lVar25 * 4) * fVar35 + 0.5) - fVar33;
                  fVar34 = floorf(__x);
                  (&local_238.order)[lVar25] =
                       (ChannelOrder)
                       (((__x - fVar34) * 0.5 + fVar34 + 0.25 + -0.5 + fVar33) / fVar35);
                  lVar25 = lVar25 + 1;
                } while (lVar25 == 1);
              }
              else {
                local_258._0_4_ = (undefined4)uVar7;
                local_258._4_4_ = SUB84(uVar7,4);
                local_238.order = local_258._0_4_;
                local_238.type = local_258._4_4_;
                local_258._0_8_ = uVar8;
              }
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         &vStack_1f0,(Vector<float,_2> *)&local_238);
              iVar24 = iVar24 + 1;
            } while (iVar24 != 4);
            iVar15 = iVar15 + 1;
          } while (iVar15 < (int)local_210._0_4_);
        }
        iVar15 = (int)(float)local_218 + 1;
        local_218 = CONCAT44(local_218._4_4_,iVar15);
      } while (iVar15 < (int)local_210._0_4_);
    }
    puVar11 = local_1c0;
    local_100 = (ulong)*local_1c0;
    local_108 = (ulong)local_1c0[1];
    uVar30 = local_1c0[2];
    height = local_1c0[3];
    glwViewport(*local_1c0 + (int)local_170,local_1c0[1] + (int)local_178,uVar30,height);
    uVar5 = puVar11[4];
    program = (local_240->m_program->m_program).m_program;
    GVar16 = glwGetAttribLocation(program,"a_position");
    if (GVar16 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar16);
      glwVertexAttribPointer
                (GVar16,2,0x1406,'\0',0,
                 local_208.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    GVar16 = glwGetAttribLocation(program,"a_texCoord");
    if (GVar16 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar16);
      glwVertexAttribPointer
                (GVar16,2,0x1406,'\0',0,
                 vStack_1f0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    GVar17 = glwGetUniformLocation(program,"u_lod");
    if (GVar17 != -1) {
      glwUniform1f(GVar17,local_244);
    }
    glwActiveTexture(0x84c0);
    glwBindTexture(0xde1,local_240->m_textures[(int)uVar5]->m_glTexture);
    glwTexParameteri(0xde1,0x2802,local_240->m_wrapS);
    glwTexParameteri(0xde1,0x2803,local_240->m_wrapT);
    glwTexParameteri(0xde1,0x2801,local_240->m_minFilter);
    glwTexParameteri(0xde1,0x2800,local_240->m_magFilter);
    GVar17 = glwGetUniformLocation(program,"u_texture");
    if (GVar17 != -1) {
      glwUniform1i(GVar17,0);
    }
    glwDrawElements(4,local_210._0_4_ * local_210._0_4_ * 6,0x1403,
                    local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    pTVar6 = local_240->m_textures[(int)uVar5];
    glu::mapGLSampler((Sampler *)local_168,local_240->m_wrapS,local_240->m_wrapT,
                      local_240->m_minFilter,local_240->m_magFilter);
    uVar10 = local_210._0_4_;
    uVar26 = (ulong)local_210 & 0xffffffff;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1a0,
               (long)(int)(local_210._0_4_ * local_210._0_4_),(allocator_type *)local_258);
    if (0 < (int)uVar10) {
      lVar25 = 0;
      fVar32 = 0.0;
      do {
        uVar31 = 0;
        do {
          iVar15 = (local_210._0_4_ * (int)fVar32 + (int)uVar31) * 4;
          tcu::sampleLevelArray2D
                    ((ConstPixelBufferAccess *)local_258,(int)(pTVar6->m_refTexture).m_view.m_levels
                     ,(Sampler *)(ulong)(uint)(pTVar6->m_refTexture).m_view.m_numLevels,
                     vStack_1f0.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[0],
                     vStack_1f0.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[1],(int)local_168,
                     local_244);
          pTVar1 = (TextureFormat *)((long)local_1a0 + (long)((int)uVar31 + (int)lVar25) * 0x10);
          pTVar1->order = local_258._0_4_;
          pTVar1->type = local_258._4_4_;
          pTVar1[1].order = local_258._8_4_;
          pTVar1[1].type = local_258._12_4_;
          uVar31 = uVar31 + 1;
        } while (uVar26 != uVar31);
        fVar32 = (float)((int)fVar32 + 1);
        lVar25 = lVar25 + uVar26;
      } while (fVar32 != (float)uVar10);
    }
    local_1c0 = (uint *)(long)(int)local_210._0_4_;
    if (0 < (long)local_1c0) {
      fVar33 = (float)(int)uVar30;
      local_244 = (float)(int)height;
      fVar32 = 0.0;
      local_220 = local_220 & 0xffffffff00000000;
      do {
        uVar26 = 0;
        local_1a4 = fVar32;
        do {
          lVar25 = 0;
          do {
            *(float *)(local_258 + lVar25 * 4) =
                 ((pointer)((long)local_1a0 + (long)(int)fVar32 * 0x10))->m_data[lVar25];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          iVar15 = local_210._0_4_ * (int)local_220 + (int)uVar26;
          local_120 = *(undefined8 *)
                       local_208.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar15 * 4].m_data;
          local_118 = *(undefined8 *)
                       local_208.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar15 * 4 + 3].m_data;
          local_188[0] = 0.0;
          local_188[1] = 0.0;
          local_188[2] = 0.0;
          local_188[3] = 0.0;
          lVar25 = 0;
          do {
            local_188[lVar25] = *(float *)((long)&local_120 + lVar25 * 4) * 0.5;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          local_238.order = R;
          local_238.type = SNORM_INT8;
          uStack_230 = 0;
          lVar25 = 0;
          do {
            (&local_238.order)[lVar25] = (ChannelOrder)(local_188[lVar25] + 0.5);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          local_248 = fVar32;
          local_218 = uVar26;
          fVar32 = ceilf((float)local_238.order * fVar33 + -0.5);
          fVar35 = ceilf((float)uStack_230 * fVar33 + -0.5);
          fVar34 = ceilf((float)local_238.type * local_244 + -0.5);
          iVar15 = (int)fVar34;
          fVar34 = ceilf(uStack_230._4_4_ * local_244 + -0.5);
          if (iVar15 < (int)fVar34) {
            iVar24 = (int)fVar32;
            iVar27 = (int)local_108 + iVar15;
            iVar2 = (int)local_100;
            do {
              iVar29 = iVar2 + iVar24;
              iVar21 = (int)fVar35 - iVar24;
              if (iVar24 < (int)fVar35) {
                do {
                  tcu::RGBA::RGBA(&local_1b4,(Vec4 *)local_258);
                  *(deUint32 *)
                   ((long)local_f8.m_pixels.m_ptr + (long)(local_f8.m_width * iVar27 + iVar29) * 4)
                       = local_1b4.m_value;
                  iVar29 = iVar29 + 1;
                  iVar21 = iVar21 + -1;
                } while (iVar21 != 0);
              }
              iVar15 = iVar15 + 1;
              iVar27 = iVar27 + 1;
            } while (iVar15 != (int)fVar34);
          }
          uVar26 = local_218 + 1;
          fVar32 = (float)((int)local_248 + 1);
        } while ((uint *)uVar26 != local_1c0);
        iVar15 = (int)local_220 + 1;
        fVar32 = (float)((int)local_1a4 + (int)local_1c0);
        local_220 = CONCAT44(local_220._4_4_,iVar15);
      } while (iVar15 != (int)local_1c0);
    }
    if (local_1a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a0,(long)local_190 - (long)local_1a0);
    }
    if (local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_1f0.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_1f0.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_1f0.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_1f0.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar25 = local_110 + 1;
  } while (lVar25 != 4);
  tcu::Surface::Surface((Surface *)local_210,local_1a8,local_1ac);
  pVVar9 = local_240;
  context = ((local_240->super_TestCase).m_context)->m_renderCtx;
  local_168._0_4_ = RGBA;
  local_168._4_4_ = UNORM_INT8;
  data = local_208.
         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
  if (local_208.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    data = local_208.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_d8,(TextureFormat *)local_168,local_210._0_4_,
             local_210._4_4_,1,data);
  glu::readPixels(context,(int)local_170,(int)local_178,(PixelBufferAccess *)local_d8);
  glwUseProgram(0);
  bVar12 = compareImages(((pVVar9->super_TestCase).m_context)->m_renderCtx,
                         ((pVVar9->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         &local_f8,(Surface *)local_210);
  description = "Image comparison failed";
  if (bVar12) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pVVar9->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar12,
             description);
  tcu::Surface::~Surface((Surface *)local_210);
  tcu::Surface::~Surface(&local_f8);
  return STOP;
}

Assistant:

Vertex2DTextureCase::IterateResult Vertex2DTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_2D_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_2D_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 cells.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(+1.8f, +1.8f);
	const Vec2 texMinOffset		(-0.3f, -0.2f);
	const Vec2 texMagScale		(+0.3f, +0.3f);
	const Vec2 texMagOffset		(+0.9f, +0.8f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	{
		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(0,				0,				leftWidth,	bottomHeight),	0, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		0,				rightWidth,	bottomHeight),	0, texMagScale, texMagOffset),
			Render(Rect(0,				bottomHeight,	leftWidth,	topHeight),		1, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		bottomHeight,	rightWidth,	topHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_2D, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_2D>(rend.texCoordScale, rend.texCoordOffset), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}